

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

int32 gauden_dist_norm(gauden_t *g,int32 n_top,gauden_dist_t ***dist,uint8 *active)

{
  gauden_dist_t *pgVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int32 best;
  int iVar7;
  
  lVar3 = (long)g->n_mgau;
  if (lVar3 < 2) {
    if (g->n_feat < 1) {
      iVar7 = 0;
    }
    else {
      lVar3 = 0;
      iVar7 = 0;
      do {
        iVar2 = (*dist)[lVar3]->dist;
        if (1 < n_top) {
          lVar6 = 0;
          do {
            iVar2 = logmath_add(g->logmath,iVar2,(*dist)[lVar3][lVar6 + 1].dist);
            lVar6 = lVar6 + 1;
          } while ((ulong)(uint)n_top - 1 != lVar6);
        }
        if (0 < n_top) {
          pgVar1 = (*dist)[lVar3];
          uVar5 = 0;
          do {
            pgVar1[uVar5].dist = pgVar1[uVar5].dist - iVar2;
            uVar5 = uVar5 + 1;
          } while ((uint)n_top != uVar5);
        }
        iVar7 = iVar7 + iVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < g->n_feat);
    }
  }
  else {
    iVar7 = -0x38000000;
    lVar6 = 0;
    do {
      if (((active == (uint8 *)0x0) || (active[lVar6] != '\0')) && (0 < (long)g->n_feat)) {
        lVar4 = 0;
        do {
          if (0 < n_top) {
            uVar5 = 0;
            do {
              if (iVar7 <= dist[lVar6][lVar4][uVar5].dist) {
                iVar7 = dist[lVar6][lVar4][uVar5].dist;
              }
              uVar5 = uVar5 + 1;
            } while ((uint)n_top != uVar5);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != g->n_feat);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar3);
    lVar6 = 0;
    do {
      if (((active == (uint8 *)0x0) || (active[lVar6] != '\0')) &&
         (iVar2 = g->n_feat, 0 < (long)iVar2)) {
        lVar4 = 0;
        do {
          if (0 < n_top) {
            pgVar1 = dist[lVar6][lVar4];
            uVar5 = 0;
            do {
              pgVar1[uVar5].dist = pgVar1[uVar5].dist - iVar7;
              uVar5 = uVar5 + 1;
            } while ((uint)n_top != uVar5);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != iVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar3);
    iVar7 = iVar7 * g->n_feat;
  }
  return iVar7;
}

Assistant:

int32
gauden_dist_norm(gauden_t * g, int32 n_top, gauden_dist_t *** dist,
                 uint8 * active)
{
    int32 gid, f, t;
    int32 sum, scale;

    if (g->n_mgau > 1) {
        /* Normalize by subtracting max(density values) from each density */
        return (gauden_dist_norm_global(g, n_top, dist, active));
    }

    /* Normalize by subtracting log(sum of density values) from each density */
    gid = 0;
    scale = 0;
    for (f = 0; f < g->n_feat; f++) {
        sum = dist[gid][f][0].dist;
        for (t = 1; t < n_top; t++)
            sum = logmath_add(g->logmath, sum, dist[gid][f][t].dist);

        for (t = 0; t < n_top; t++)
            dist[gid][f][t].dist -= sum;

        scale += sum;
    }

    return scale;               /* Scale factor applied to EVERY senone score */
}